

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

int irr::CIrrDeviceSDL::findCharToPassToIrrlicht(int assumedChar,EKEY_CODE key)

{
  if ((key == KEY_RETURN) || (key == KEY_ESCAPE)) {
    return key;
  }
  if ((((uint)assumedChar >> 0x1e & 1) == 0) && ((7 < key - KEY_PRIOR && (key != KEY_NUMLOCK)))) {
    return assumedChar;
  }
  return 0;
}

Assistant:

int CIrrDeviceSDL::findCharToPassToIrrlicht(int assumedChar, EKEY_CODE key)
{
	// special cases that always return a char regardless of how the SDL keycode
	// looks
	switch (key) {
	case KEY_RETURN:
	case KEY_ESCAPE:
		return (int)key;
	default:
		break;
	}

	// SDL in-place ORs values with no character representation with 1<<30
	// https://wiki.libsdl.org/SDL2/SDLKeycodeLookup
	if (assumedChar & (1 << 30))
		return 0;

	switch (key) {
	case KEY_PRIOR:
	case KEY_NEXT:
	case KEY_HOME:
	case KEY_END:
	case KEY_LEFT:
	case KEY_UP:
	case KEY_RIGHT:
	case KEY_DOWN:
	case KEY_NUMLOCK:
		return 0;
	default:
		return assumedChar;
	}
}